

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  undefined1 uVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  if (ptr == end) {
    return -4;
  }
  uVar6 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pbVar5 = (byte *)(ptr + uVar6);
  if (uVar6 == 0) {
    pbVar5 = (byte *)end;
  }
  bVar8 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar8) {
    pbVar5 = (byte *)end;
  }
  if (bVar8 && uVar6 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    uVar3 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar3 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004e21e3:
        uVar3 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar3 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e21e3;
    uVar3 = 0;
  }
  switch(uVar3) {
  case 0:
  case 1:
  case 8:
    iVar2 = 0;
    goto LAB_004e23aa;
  case 4:
    pbVar4 = (byte *)(ptr + 2);
    if (pbVar4 == pbVar5) {
      return -1;
    }
    if ((ptr[3] == '\0') && (*pbVar4 == 0x5d)) {
      if ((byte *)(ptr + 4) == pbVar5) {
        return -1;
      }
      if ((ptr[5] == '\0') && (ptr[4] == 0x3e)) {
        ptr = ptr + 6;
        iVar2 = 0x28;
        goto LAB_004e23aa;
      }
    }
    break;
  case 5:
    if ((long)pbVar5 - (long)ptr < 2) {
      return -2;
    }
  default:
    pbVar4 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pbVar5 - (long)ptr < 3) {
      return -2;
    }
    pbVar4 = (byte *)(ptr + 3);
    break;
  case 7:
    if ((long)pbVar5 - (long)ptr < 4) {
      return -2;
    }
    pbVar4 = (byte *)(ptr + 4);
    break;
  case 9:
    pbVar4 = (byte *)(ptr + 2);
    if (pbVar4 == pbVar5) {
      return -1;
    }
    if (ptr[3] == '\0') {
      bVar8 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4) == '\n';
    }
    else {
      bVar8 = false;
    }
    ptr = ptr + 4;
    if (!bVar8) {
      ptr = (char *)pbVar4;
    }
    goto LAB_004e23a5;
  case 10:
    ptr = ptr + 2;
LAB_004e23a5:
    iVar2 = 7;
    goto LAB_004e23aa;
  }
  iVar2 = 6;
  for (ptr = (char *)pbVar4; (byte *)ptr != pbVar5; ptr = (char *)((byte *)ptr + lVar7)) {
    bVar1 = ((byte *)ptr)[1];
    if (bVar1 < 0xdc) {
      uVar3 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar3 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        }
        else {
LAB_004e2325:
          uVar3 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar3 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e2325;
      uVar3 = 0;
    }
    lVar7 = 2;
    switch(uVar3) {
    case 0:
    case 1:
    case 4:
    case 8:
    case 9:
    case 10:
      goto switchD_004e233f_caseD_0;
    case 5:
      if ((long)pbVar5 - (long)ptr < 2) goto switchD_004e233f_caseD_0;
      break;
    case 6:
      lVar7 = 3;
      if ((long)pbVar5 - (long)ptr < 3) goto switchD_004e233f_caseD_0;
      break;
    case 7:
      lVar7 = 4;
      if ((long)pbVar5 - (long)ptr < 4) goto switchD_004e233f_caseD_0;
    }
  }
switchD_004e233f_caseD_0:
LAB_004e23aa:
  *nextTokPtr = ptr;
  return iVar2;
}

Assistant:

static
int PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                            const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_PARTIAL;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}